

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Node.h
# Opt level: O2

bool dg::Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>::_addBidirectionalEdge
               (LLVMNode *ths,LLVMNode *n,EdgesT *ths_cont,EdgesT *n_cont)

{
  bool bVar1;
  
  DGContainer<dg::LLVMNode_*,_4U>::insert(&n_cont->super_DGContainer<dg::LLVMNode_*,_4U>,ths);
  bVar1 = DGContainer<dg::LLVMNode_*,_4U>::insert
                    (&ths_cont->super_DGContainer<dg::LLVMNode_*,_4U>,n);
  return bVar1;
}

Assistant:

static bool _addBidirectionalEdge(NodeT *ths, NodeT *n, EdgesT &ths_cont,
                                      EdgesT &n_cont) {
#ifndef NDEBUG
        bool ret1 =
#endif
                n_cont.insert(ths);
        bool ret2 = ths_cont.insert(n);

        assert(ret1 == ret2 &&
               "Already had one of the edges, but not the other");

        return ret2;
    }